

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

wchar_t assertion_file_size(char *file,wchar_t line,char *pathname,long size)

{
  int iVar1;
  stat st;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,(stat *)&st);
  if (iVar1 != 0 || st.st_size != size) {
    failure_start(file,line,"File %s has size %ld, expected %ld",pathname,st.st_size,size);
    failure_finish((void *)0x0);
  }
  return (uint)(iVar1 == 0 && st.st_size == size);
}

Assistant:

int
assertion_file_size(const char *file, int line, const char *pathname, long size)
{
	int64_t filesize;
	int r;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	{
		BY_HANDLE_FILE_INFORMATION bhfi;
		r = !my_GetFileInformationByName(pathname, &bhfi);
		filesize = ((int64_t)bhfi.nFileSizeHigh << 32) + bhfi.nFileSizeLow;
	}
#else
	{
		struct stat st;
		r = lstat(pathname, &st);
		filesize = st.st_size;
	}
#endif
	if (r == 0 && filesize == size)
			return (1);
	failure_start(file, line, "File %s has size %ld, expected %ld",
	    pathname, (long)filesize, (long)size);
	failure_finish(NULL);
	return (0);
}